

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh_fixture.c
# Opt level: O3

libssh2_socket_t open_socket_to_openssh_server(void)

{
  int iVar1;
  int iVar2;
  in_addr_t iVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  ulong extraout_RAX;
  uint __seconds;
  char *ip_address;
  char *port_string;
  char *local_58;
  char *local_50 [2];
  sockaddr local_40;
  
  pcVar5 = running_container_id;
  local_58 = (char *)0x0;
  local_50[0] = (char *)0x0;
  if (have_docker == 0) {
    pcVar4 = getenv("OPENSSH_SERVER_HOST");
    pcVar5 = "127.0.0.1";
    if (pcVar4 != (char *)0x0) {
      pcVar5 = pcVar4;
    }
    local_58 = strdup(pcVar5);
    pcVar4 = getenv("OPENSSH_SERVER_PORT");
    pcVar5 = "4711";
    if (pcVar4 != (char *)0x0) {
      pcVar5 = pcVar4;
    }
LAB_00103213:
    local_50[0] = strdup(pcVar5);
  }
  else {
    pcVar4 = getenv("DOCKER_MACHINE_NAME");
    if (pcVar4 == (char *)0x0) {
      iVar1 = is_running_inside_a_container();
      pcVar4 = "docker inspect --format \"{{ .NetworkSettings.IPAddress }}\" %s";
      if (iVar1 == 0) {
        pcVar4 = 
        "docker inspect --format \"{{ index (index (index .NetworkSettings.Ports \\\"22/tcp\\\") 0) \\\"HostIp\\\" }}\" %s"
        ;
      }
      iVar1 = run_command(&local_58,pcVar4,pcVar5);
      if (iVar1 == 0) goto LAB_00103203;
LAB_00103319:
      pcVar4 = "Failed to get IP address for container %s\n";
LAB_0010333d:
      fprintf(_stderr,pcVar4,pcVar5);
      goto LAB_00103347;
    }
    iVar1 = run_command(&local_58,"docker-machine ip %s",pcVar4);
    if (iVar1 != 0) {
      __seconds = 500;
      iVar1 = 7;
      do {
        iVar1 = iVar1 + -1;
        if (iVar1 == 0) {
          open_socket_to_openssh_server_cold_1();
          goto LAB_00103319;
        }
        sleep(__seconds);
        __seconds = __seconds * 2;
        iVar2 = run_command(&local_58,"docker-machine ip %s",pcVar4);
      } while (iVar2 != 0);
    }
LAB_00103203:
    iVar1 = is_running_inside_a_container();
    if (iVar1 != 0) {
      pcVar5 = "22";
      goto LAB_00103213;
    }
    iVar1 = run_command(local_50,
                        "docker inspect --format \"{{ index (index (index .NetworkSettings.Ports \\\"22/tcp\\\") 0) \\\"HostPort\\\" }}\" %s"
                        ,pcVar5);
    if (iVar1 != 0) {
      pcVar4 = "Failed to get port for container %s\n";
      goto LAB_0010333d;
    }
  }
  pcVar5 = local_58;
  if (local_58 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    iVar1 = strcmp(local_58,"0.0.0.0");
    if (iVar1 == 0) {
      free(pcVar5);
      pcVar5 = strdup("127.0.0.1");
      local_58 = pcVar5;
    }
  }
  iVar3 = inet_addr(pcVar5);
  if (iVar3 == 0xffffffff) {
    open_socket_to_openssh_server_cold_4();
  }
  else {
    iVar1 = socket(2,1,0);
    if (iVar1 == -1) {
      open_socket_to_openssh_server_cold_3();
    }
    else {
      local_40.sa_family = 2;
      lVar6 = strtol(local_50[0],(char **)0x0,0);
      local_40.sa_data._0_2_ = (ushort)lVar6 << 8 | (ushort)lVar6 >> 8;
      local_40.sa_data._2_4_ = iVar3;
      do {
        iVar2 = connect(iVar1,&local_40,0x10);
        if (iVar2 == 0) goto LAB_0010334c;
        open_socket_to_openssh_server_cold_2();
      } while ((extraout_RAX & 1) != 0);
    }
  }
LAB_00103347:
  iVar1 = -1;
LAB_0010334c:
  free(local_58);
  free(local_50[0]);
  return iVar1;
}

Assistant:

libssh2_socket_t open_socket_to_openssh_server(void)
{
    return open_socket_to_container(running_container_id);
}